

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O1

void __thiscall Sandbox::renderUI(Sandbox *this)

{
  _Rb_tree_header *p_Var1;
  UniformFunctionsMap *pUVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  bool bVar15;
  uint uVar16;
  long lVar17;
  double dVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  char *pcVar27;
  char *pcVar28;
  bool bVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  WindowStyle WVar33;
  iterator iVar34;
  _Rb_tree_node_base *p_Var35;
  mapped_type *pmVar36;
  vec2 *pvVar37;
  pointer ppPVar38;
  pointer pPVar39;
  ulong uVar40;
  Fbo *_fbo;
  pointer pFVar41;
  pointer ppFVar42;
  mat4 *pmVar43;
  Vbo *pVVar44;
  Vbo *this_00;
  Shader *pSVar45;
  Camera *pCVar46;
  vec2 vVar47;
  _Self __tmp;
  char *pcVar48;
  Tracker *this_01;
  char *pcVar49;
  Pyramid *this_02;
  char *__end;
  ulong uVar50;
  float fVar51;
  undefined4 uVar52;
  float _far;
  float _near;
  undefined4 uVar53;
  float fVar54;
  float _x;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 _x_00;
  float _width;
  float fVar55;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  float local_1bc;
  float local_1b0;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_1a0;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_19c;
  vec2 local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  float local_17c;
  undefined1 local_178 [16];
  long *local_168 [2];
  long local_158 [2];
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_148;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_144;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aStack_140;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_13c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_138;
  pointer pvStack_128;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_120;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_11c;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aStack_118;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_114;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aStack_110;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_10c;
  float local_9c;
  undefined1 local_98 [16];
  Tracker *local_88;
  UniformFunctionsMap *local_80;
  double local_78;
  double local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  this_01 = &(this->uniforms).tracker;
  if ((this->uniforms).tracker.m_running == true) {
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"renderUI","");
    Tracker::begin(this_01,(string *)&local_148);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
  }
  local_88 = this_01;
  if ((this->m_showTextures == true) &&
     (iVar31 = (int)(this->uniforms).super_Scene.textures._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count, 0 < iVar31)) {
    glDisable();
    if ((this->uniforms).tracker.m_running == true) {
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"renderUI:textures","");
      Tracker::begin(this_01,(string *)&local_148);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
    }
    iVar30 = vera::getWindowWidth();
    local_17c = (float)iVar30;
    iVar30 = vera::getWindowHeight();
    local_1bc = (float)iVar30;
    dVar18 = (double)(1.0 / (float)iVar31);
    if (0.25 <= dVar18) {
      dVar18 = 0.25;
    }
    local_17c = local_17c * (float)(dVar18 * 0.5) * (local_1bc / local_17c);
    vera::textAngle(0.0,(Font *)0x0);
    vera::textAlign(ALIGN_TOP,(Font *)0x0);
    vera::textAlign(ALIGN_LEFT,(Font *)0x0);
    local_178._0_4_ = local_17c * 0.2;
    fVar51 = vera::getPixelDensity(false);
    vera::textSize((float)local_178._0_4_ / fVar51,(Font *)0x0);
    p_Var35 = (this->uniforms).super_Scene.textures._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    p_Var1 = &(this->uniforms).super_Scene.textures._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var35 != p_Var1) {
      fVar54 = (float)(dVar18 * 0.5) * local_1bc;
      local_1bc = local_1bc - fVar54;
      fVar51 = local_17c * 0.5;
      local_98._8_4_ = 0;
      local_98._0_8_ = -(double)fVar54 + -(double)fVar54;
      local_98._12_4_ = 0x80000000;
      do {
        iVar31 = (**(code **)(**(long **)(p_Var35 + 2) + 0x60))();
        local_178._0_4_ = (float)iVar31;
        iVar31 = (**(code **)(**(long **)(p_Var35 + 2) + 0x68))();
        local_178._0_4_ = ((float)local_178._0_4_ / (float)iVar31) * local_17c;
        iVar34 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
                 ::find(&(this->uniforms).super_Scene.streams._M_t,(key_type *)(p_Var35 + 1));
        if ((_Rb_tree_header *)iVar34._M_node ==
            &(this->uniforms).super_Scene.streams._M_t._M_impl.super__Rb_tree_header) {
          vera::image(*(Texture **)(p_Var35 + 2),(float)local_178._0_4_ * 0.5 + fVar51,local_1bc,
                      (float)local_178._0_4_,fVar54);
        }
        else {
          vera::image(*(TextureStream **)(iVar34._M_node + 2),(float)local_178._0_4_ * 0.5 + fVar51,
                      local_1bc,(float)local_178._0_4_,fVar54,true);
        }
        iVar31 = vera::getWindowHeight();
        vera::text((string *)(p_Var35 + 1),0.0,((float)iVar31 - local_1bc) - fVar54,(Font *)0x0);
        local_1bc = (float)((double)local_1bc + (double)local_98._0_8_);
        p_Var35 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var35);
      } while ((_Rb_tree_header *)p_Var35 != p_Var1);
    }
    this_01 = local_88;
    if ((this->uniforms).tracker.m_running != false) {
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"renderUI:textures","");
      Tracker::end(this_01,(string *)&local_148);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  if (this->m_showPasses == true) {
    glDisable(0xb71);
    if ((this->uniforms).tracker.m_running == true) {
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"renderUI:buffers","");
      Tracker::begin(this_01,(string *)&local_148);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
    }
    iVar31 = (int)((long)(this->uniforms).floods.
                         super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->uniforms).floods.
                         super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                         super__Vector_impl_data._M_start >> 6) * -0x55555555 +
             (int)((long)(this->uniforms).pyramids.
                         super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->uniforms).pyramids.
                         super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                         super__Vector_impl_data._M_start >> 7) * -0x45d1745d +
             (int)((long)(this->uniforms).doubleBuffers.
                         super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->uniforms).doubleBuffers.
                         super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) +
             (int)((long)(this->uniforms).buffers.
                         super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->uniforms).buffers.
                         super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3);
    if ((this->uniforms).super_Scene.models._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_scene","");
      pUVar2 = &(this->uniforms).functions;
      pmVar36 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](pUVar2,(key_type *)&local_148);
      bVar29 = pmVar36->present;
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_sceneDepth","");
      pmVar36 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](pUVar2,(key_type *)&local_148);
      bVar15 = pmVar36->present;
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      iVar31 = (uint)bVar29 + iVar31 + 1 + (uint)bVar15;
    }
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_sceneNormal","");
    pUVar2 = &(this->uniforms).functions;
    pmVar36 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
              ::operator[](pUVar2,(key_type *)&local_148);
    bVar29 = pmVar36->present;
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_scenePosition","");
    pmVar36 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
              ::operator[](pUVar2,(key_type *)&local_148);
    bVar15 = pmVar36->present;
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    iVar31 = (uint)bVar15 + iVar31 + (uint)bVar29 + (int)(this->m_sceneRender).m_buffers_total;
    if (0 < iVar31) {
      local_80 = pUVar2;
      iVar30 = vera::getWindowWidth();
      iVar32 = vera::getWindowHeight();
      dVar18 = (double)(1.0 / (float)iVar31);
      if (0.25 <= dVar18) {
        dVar18 = 0.25;
      }
      _width = (float)(dVar18 * 0.5) * (float)iVar30;
      fVar51 = (float)(dVar18 * 0.5) * (float)iVar32;
      _x = (float)iVar30 - _width;
      local_1b0 = (float)iVar32 - fVar51;
      vera::textAngle(0.0,(Font *)0x0);
      fVar54 = vera::getPixelDensity(false);
      vera::textSize((_width * 0.2) / fVar54,(Font *)0x0);
      vera::textAlign(ALIGN_TOP,(Font *)0x0);
      vera::textAlign(ALIGN_LEFT,(Font *)0x0);
      local_168[0] = (long *)0x0;
      ppFVar42 = (this->uniforms).buffers.
                 super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->uniforms).buffers.super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppFVar42) {
        local_178._8_4_ = 0;
        local_178._0_8_ = -(double)fVar51 + -(double)fVar51;
        local_178._12_4_ = 0x80000000;
        do {
          iVar31 = (*ppFVar42[(long)local_168[0]]->_vptr_Fbo[5])();
          iVar30 = (*(this->uniforms).buffers.
                     super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)local_168[0]]->_vptr_Fbo[6])();
          fVar54 = ((float)iVar31 / (float)iVar30) * fVar51;
          vera::image((this->uniforms).buffers.
                      super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)local_168[0]],(_width - fVar54) + _x,
                      local_1b0,fVar54,fVar51);
          vera::toString<unsigned_long>((string *)&local_1a0,(unsigned_long *)local_168);
          pvVar37 = (vec2 *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x2f25a1);
          vVar47 = (vec2)(pvVar37 + 2);
          if (*pvVar37 == vVar47) {
            aStack_138._8_8_ = pvVar37[3];
            aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
            aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
            _local_148 = (vec2)&aStack_138;
          }
          else {
            aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
            aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
            _local_148 = *pvVar37;
          }
          aStack_140 = pvVar37[1].field_0;
          aStack_13c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                       pvVar37[1].field_1;
          *pvVar37 = vVar47;
          pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
          pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
          *(undefined1 *)&pvVar37[2].field_0 = 0;
          iVar31 = vera::getWindowHeight();
          vera::text((string *)&local_148,_x - fVar54,((float)iVar31 - local_1b0) - fVar51,
                     (Font *)0x0);
          if (_local_148 != (vec2)&aStack_138) {
            operator_delete((void *)_local_148,
                            CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                     aStack_138._M_allocated_capacity._0_4_) + 1);
          }
          if (_local_1a0 != (vec2)&local_190) {
            operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
          }
          local_1b0 = (float)((double)local_1b0 + (double)local_178._0_8_);
          local_168[0] = (long *)((long)local_168[0] + 1);
          ppFVar42 = (this->uniforms).buffers.
                     super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
        } while (local_168[0] <
                 (long *)((long)(this->uniforms).buffers.
                                super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar42 >> 3));
      }
      local_168[0] = (long *)0x0;
      ppPVar38 = (this->uniforms).doubleBuffers.
                 super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->uniforms).doubleBuffers.
          super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppPVar38) {
        local_178._8_4_ = 0;
        local_178._0_8_ = -(double)fVar51 + -(double)fVar51;
        local_178._12_4_ = 0x80000000;
        do {
          iVar31 = (*ppPVar38[(long)local_168[0]]->src->_vptr_Fbo[5])();
          iVar30 = (*(this->uniforms).doubleBuffers.
                     super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl
                     .super__Vector_impl_data._M_start[(long)local_168[0]]->src->_vptr_Fbo[6])();
          fVar54 = ((float)iVar31 / (float)iVar30) * fVar51;
          vera::image((this->uniforms).doubleBuffers.
                      super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[(long)local_168[0]]->src,
                      (_width - fVar54) + _x,local_1b0,fVar54,fVar51);
          vera::toString<unsigned_long>((string *)&local_1a0,(unsigned_long *)local_168);
          pvVar37 = (vec2 *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x2f25bc);
          vVar47 = (vec2)(pvVar37 + 2);
          if (*pvVar37 == vVar47) {
            aStack_138._8_8_ = pvVar37[3];
            aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
            aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
            _local_148 = (vec2)&aStack_138;
          }
          else {
            aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
            aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
            _local_148 = *pvVar37;
          }
          aStack_140 = pvVar37[1].field_0;
          aStack_13c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                       pvVar37[1].field_1;
          *pvVar37 = vVar47;
          pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
          pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
          *(undefined1 *)&pvVar37[2].field_0 = 0;
          iVar31 = vera::getWindowHeight();
          vera::text((string *)&local_148,_x - fVar54,((float)iVar31 - local_1b0) - fVar51,
                     (Font *)0x0);
          if (_local_148 != (vec2)&aStack_138) {
            operator_delete((void *)_local_148,
                            CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                     aStack_138._M_allocated_capacity._0_4_) + 1);
          }
          if (_local_1a0 != (vec2)&local_190) {
            operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
          }
          local_1b0 = (float)((double)local_1b0 + (double)local_178._0_8_);
          local_168[0] = (long *)((long)local_168[0] + 1);
          ppPVar38 = (this->uniforms).doubleBuffers.
                     super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
        } while (local_168[0] <
                 (long *)((long)(this->uniforms).doubleBuffers.
                                super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar38 >> 3));
      }
      local_168[0] = (long *)0x0;
      pPVar39 = (this->uniforms).pyramids.
                super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->uniforms).pyramids.
          super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
          super__Vector_impl_data._M_finish != pPVar39) {
        dVar18 = (double)fVar51;
        local_70 = (double)_x;
        local_78 = -dVar18 + -dVar18;
        local_58 = dVar18 * 0.5;
        uStack_50 = 0;
        local_68._8_4_ = 0;
        local_68._0_8_ = -dVar18 * 0.5;
        local_68._12_4_ = 0x80000000;
        do {
          iVar31 = (*pPVar39[(long)local_168[0]]._vptr_Pyramid[2])(pPVar39 + (long)local_168[0]);
          local_9c = (float)iVar31;
          pPVar39 = (this->uniforms).pyramids.
                    super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar31 = (*pPVar39[(long)local_168[0]]._vptr_Pyramid[3])(pPVar39 + (long)local_168[0]);
          local_1bc = (local_9c / (float)iVar31) * fVar51;
          pPVar39 = (this->uniforms).pyramids.
                    super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar16 = pPVar39[(long)local_168[0]].m_depth;
          uVar40 = (ulong)uVar16;
          if ((uVar16 & 0x7fffffff) != 0) {
            this_02 = pPVar39 + (long)local_168[0];
            fVar55 = (_width - local_1bc) + _x;
            local_48._8_4_ = (int)uStack_50;
            local_48._0_8_ = local_58 + (double)local_1b0;
            local_48._12_4_ = (int)((ulong)uStack_50 >> 0x20);
            local_98._0_8_ = (double)local_1b0 + (double)local_68._0_8_;
            uVar50 = 0;
            local_178._0_4_ = fVar51;
            fVar54 = local_1b0;
            local_9c = local_1bc;
            do {
              local_17c = fVar54;
              _fbo = vera::Pyramid::getResult(this_02,(uint)uVar50);
              fVar54 = fVar55;
              if (uVar40 <= uVar50) {
                fVar54 = local_9c + local_9c + fVar55;
              }
              vera::image(_fbo,fVar54,local_17c,local_1bc,(float)local_178._0_4_);
              pPVar39 = (this->uniforms).pyramids.
                        super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar16 = pPVar39[(long)local_168[0]].m_depth;
              uVar40 = (ulong)uVar16;
              uVar52 = local_98._0_4_;
              uVar53 = local_98._4_4_;
              if (uVar50 >= uVar40) {
                uVar52 = local_48._0_4_;
                uVar53 = local_48._4_4_;
              }
              fVar55 = fVar55 - local_1bc;
              this_02 = pPVar39 + (long)local_168[0];
              local_1bc = local_1bc * *(float *)(&DAT_002ef4b0 + (ulong)(uVar50 < uVar40) * 4);
              local_178._0_4_ =
                   (float)local_178._0_4_ * *(float *)(&DAT_002ef4b0 + (ulong)(uVar50 < uVar40) * 4)
              ;
              fVar54 = (float)(double)CONCAT44(uVar53,uVar52);
              fVar55 = fVar55 - local_1bc;
              uVar50 = uVar50 + 1;
            } while (uVar50 < uVar16 * 2);
          }
          vera::toString<unsigned_long>((string *)&local_1a0,(unsigned_long *)local_168);
          pvVar37 = (vec2 *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x2f0f93);
          vVar47 = (vec2)(pvVar37 + 2);
          if (*pvVar37 == vVar47) {
            aStack_138._8_8_ = pvVar37[3];
            aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
            aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
            _local_148 = (vec2)&aStack_138;
          }
          else {
            aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
            aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
            _local_148 = *pvVar37;
          }
          aStack_140 = pvVar37[1].field_0;
          aStack_13c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                       pvVar37[1].field_1;
          *pvVar37 = vVar47;
          pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
          pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
          *(undefined1 *)&pvVar37[2].field_0 = 0;
          iVar31 = vera::getWindowHeight();
          vera::text((string *)&local_148,
                     (float)(local_70 - ((double)local_1bc + (double)local_1bc)),
                     ((float)iVar31 - local_1b0) - fVar51,(Font *)0x0);
          if (_local_148 != (vec2)&aStack_138) {
            operator_delete((void *)_local_148,
                            CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                     aStack_138._M_allocated_capacity._0_4_) + 1);
          }
          if (_local_1a0 != (vec2)&local_190) {
            operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
          }
          local_1b0 = (float)((double)local_1b0 + local_78);
          local_168[0] = (long *)((long)local_168[0] + 1);
          pPVar39 = (this->uniforms).pyramids.
                    super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (local_168[0] <
                 (long *)(((long)(this->uniforms).pyramids.
                                 super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pPVar39 >> 7) *
                         0x2e8ba2e8ba2e8ba3));
      }
      local_168[0] = (long *)0x0;
      pFVar41 = (this->uniforms).floods.
                super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->uniforms).floods.super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>.
          _M_impl.super__Vector_impl_data._M_finish != pFVar41) {
        local_178._8_4_ = 0;
        local_178._0_8_ = -(double)fVar51 + -(double)fVar51;
        local_178._12_4_ = 0x80000000;
        do {
          iVar31 = (*(pFVar41[(long)local_168[0]].super_PingPong.dst)->_vptr_Fbo[5])();
          iVar30 = (*((this->uniforms).floods.
                      super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)local_168[0]].super_PingPong.dst)->
                     _vptr_Fbo[6])();
          fVar54 = ((float)iVar31 / (float)iVar30) * fVar51;
          vera::image((this->uniforms).floods.
                      super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)local_168[0]].super_PingPong.dst,
                      (_width - fVar54) + _x,local_1b0,fVar54,fVar51);
          vera::toString<unsigned_long>((string *)&local_1a0,(unsigned_long *)local_168);
          pvVar37 = (vec2 *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x2f0e73);
          vVar47 = (vec2)(pvVar37 + 2);
          if (*pvVar37 == vVar47) {
            aStack_138._8_8_ = pvVar37[3];
            aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
            aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
            _local_148 = (vec2)&aStack_138;
          }
          else {
            aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
            aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
            _local_148 = *pvVar37;
          }
          aStack_140 = pvVar37[1].field_0;
          aStack_13c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                       pvVar37[1].field_1;
          *pvVar37 = vVar47;
          pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
          pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
          *(undefined1 *)&pvVar37[2].field_0 = 0;
          iVar31 = vera::getWindowHeight();
          vera::text((string *)&local_148,_x - fVar54,((float)iVar31 - local_1b0) - fVar51,
                     (Font *)0x0);
          if (_local_148 != (vec2)&aStack_138) {
            operator_delete((void *)_local_148,
                            CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                     aStack_138._M_allocated_capacity._0_4_) + 1);
          }
          if (_local_1a0 != (vec2)&local_190) {
            operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
          }
          local_1b0 = (float)((double)local_1b0 + (double)local_178._0_8_);
          local_168[0] = (long *)((long)local_168[0] + 1);
          pFVar41 = (this->uniforms).floods.
                    super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (local_168[0] <
                 (long *)(((long)(this->uniforms).floods.
                                 super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pFVar41 >> 6) *
                         -0x5555555555555555));
      }
      if ((this->uniforms).super_Scene.models._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
      {
        vera::fill(0.0);
        p_Var35 = (this->uniforms).super_Scene.lights._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        p_Var1 = &(this->uniforms).super_Scene.lights._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var35 != p_Var1) {
          local_178._8_4_ = 0;
          local_178._0_8_ = -(double)fVar51 + -(double)fVar51;
          local_178._12_4_ = 0x80000000;
          do {
            lVar17 = *(long *)(p_Var35 + 2);
            if ((*(char *)(lVar17 + 0x100) == '\x01') && (*(int *)(lVar17 + 0xec) != 0)) {
              vera::imageDepth((Fbo *)(lVar17 + 0xd0),_x,local_1b0,_width,fVar51,
                               *(float *)(lVar17 + 0x20c),*(float *)(lVar17 + 0x208));
              _local_148 = (vec2)&aStack_138;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_148,"u_lightShadowMap","");
              iVar31 = vera::getWindowHeight();
              vera::text((string *)&local_148,_x - _width,((float)iVar31 - local_1b0) - fVar51,
                         (Font *)0x0);
              if (_local_148 != (vec2)&aStack_138) {
                operator_delete((void *)_local_148,
                                CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                         aStack_138._M_allocated_capacity._0_4_) + 1);
              }
              local_1b0 = (float)((double)local_1b0 + (double)local_178._0_8_);
            }
            p_Var35 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var35);
          } while ((_Rb_tree_header *)p_Var35 != p_Var1);
        }
        vera::fill(1.0);
      }
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_scenePosition","");
      pUVar2 = local_80;
      pmVar36 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](local_80,(key_type *)&local_148);
      bVar29 = pmVar36->present;
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar29 != false) {
        vera::image(&(this->m_sceneRender).positionFbo,_x,local_1b0,_width,fVar51);
        _local_148 = (vec2)&aStack_138;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_scenePosition","");
        iVar31 = vera::getWindowHeight();
        vera::text((string *)&local_148,_x - _width,((float)iVar31 - local_1b0) - fVar51,(Font *)0x0
                  );
        if (_local_148 != (vec2)&aStack_138) {
          operator_delete((void *)_local_148,
                          CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                   aStack_138._M_allocated_capacity._0_4_) + 1);
        }
        local_1b0 = local_1b0 - (fVar51 + fVar51);
      }
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_sceneNormal","");
      pmVar36 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](pUVar2,(key_type *)&local_148);
      bVar29 = pmVar36->present;
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar29 != false) {
        vera::image(&(this->m_sceneRender).normalFbo,_x,local_1b0,_width,fVar51);
        _local_148 = (vec2)&aStack_138;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_sceneNormal","");
        iVar31 = vera::getWindowHeight();
        vera::text((string *)&local_148,_x - _width,((float)iVar31 - local_1b0) - fVar51,(Font *)0x0
                  );
        if (_local_148 != (vec2)&aStack_138) {
          operator_delete((void *)_local_148,
                          CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                   aStack_138._M_allocated_capacity._0_4_) + 1);
        }
        local_1b0 = local_1b0 - (fVar51 + fVar51);
      }
      local_168[0] = (long *)0x0;
      ppFVar42 = (this->m_sceneRender).buffersFbo.
                 super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->m_sceneRender).buffersFbo.
          super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppFVar42) {
        local_178._8_4_ = 0;
        local_178._0_8_ = -(double)fVar51 + -(double)fVar51;
        local_178._12_4_ = 0x80000000;
        do {
          vera::image(ppFVar42[(long)local_168[0]],_x,local_1b0,_width,fVar51);
          vera::toString<unsigned_long>((string *)&local_1a0,(unsigned_long *)local_168);
          pvVar37 = (vec2 *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x2f1d1d);
          vVar47 = (vec2)(pvVar37 + 2);
          if (*pvVar37 == vVar47) {
            aStack_138._8_8_ = pvVar37[3];
            aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
            aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
            _local_148 = (vec2)&aStack_138;
          }
          else {
            aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
            aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
            _local_148 = *pvVar37;
          }
          aStack_140 = pvVar37[1].field_0;
          aStack_13c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                       pvVar37[1].field_1;
          *pvVar37 = vVar47;
          pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
          pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
          *(undefined1 *)&pvVar37[2].field_0 = 0;
          iVar31 = vera::getWindowHeight();
          vera::text((string *)&local_148,_x - _width,((float)iVar31 - local_1b0) - fVar51,
                     (Font *)0x0);
          if (_local_148 != (vec2)&aStack_138) {
            operator_delete((void *)_local_148,
                            CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                     aStack_138._M_allocated_capacity._0_4_) + 1);
          }
          if (_local_1a0 != (vec2)&local_190) {
            operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
          }
          local_1b0 = (float)((double)local_1b0 + (double)local_178._0_8_);
          local_168[0] = (long *)((long)local_168[0] + 1);
          ppFVar42 = (this->m_sceneRender).buffersFbo.
                     super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
        } while (local_168[0] <
                 (long *)((long)(this->m_sceneRender).buffersFbo.
                                super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar42 >> 3));
      }
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_scene","");
      pUVar2 = local_80;
      pmVar36 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](local_80,(key_type *)&local_148);
      this_01 = local_88;
      bVar29 = pmVar36->present;
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar29 != false) {
        vera::image(&(this->m_sceneRender).renderFbo,_x,local_1b0,_width,fVar51);
        _local_148 = (vec2)&aStack_138;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_scene","");
        iVar31 = vera::getWindowHeight();
        vera::text((string *)&local_148,_x - _width,((float)iVar31 - local_1b0) - fVar51,(Font *)0x0
                  );
        if (_local_148 != (vec2)&aStack_138) {
          operator_delete((void *)_local_148,
                          CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                   aStack_138._M_allocated_capacity._0_4_) + 1);
        }
        local_1b0 = local_1b0 - (fVar51 + fVar51);
      }
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_sceneDepth","");
      pmVar36 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](pUVar2,(key_type *)&local_148);
      bVar29 = pmVar36->present;
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar29 != false) {
        vera::fill(0.0);
        pCVar46 = (this->uniforms).super_Scene.activeCamera;
        if (pCVar46 != (Camera *)0x0) {
          (*(pCVar46->super_Node)._vptr_Node[0x4d])();
          (*(((this->uniforms).super_Scene.activeCamera)->super_Node)._vptr_Node[0x4e])();
          vera::imageDepth(&(this->m_sceneRender).renderFbo,_x,local_1b0,_width,fVar51,_far,_near);
        }
        _local_148 = (vec2)&aStack_138;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_sceneDepth","");
        iVar31 = vera::getWindowHeight();
        vera::text((string *)&local_148,_x - _width,((float)iVar31 - local_1b0) - fVar51,(Font *)0x0
                  );
        if (_local_148 != (vec2)&aStack_138) {
          operator_delete((void *)_local_148,
                          CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                   aStack_138._M_allocated_capacity._0_4_) + 1);
        }
        vera::fill(1.0);
      }
    }
    if ((this->uniforms).tracker.m_running == true) {
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"renderUI:buffers","");
      Tracker::end(this_01,(string *)&local_148);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  if ((this->m_plot != PLOT_OFF) && (this->m_plot_texture != (Texture *)0x0)) {
    glDisable();
    if ((this->uniforms).tracker.m_running == true) {
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"renderUI:plot_data","");
      Tracker::begin(this_01,(string *)&local_148);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
    }
    fVar51 = vera::getPixelDensity(false);
    iVar31 = vera::getWindowWidth();
    pSVar45 = &this->m_plot_shader;
    vera::Shader::use(pSVar45);
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_scale","");
    fVar54 = fVar51 * 30.0;
    local_178._0_4_ = fVar51 * 100.0;
    vera::Shader::setUniform(pSVar45,(string *)&local_148,fVar51 * 100.0,fVar54);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_translate","");
    vera::Shader::setUniform(pSVar45,(string *)&local_148,(float)iVar31 * 0.5,fVar54 + 10.0);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_resolution","");
    iVar31 = vera::getWindowWidth();
    iVar30 = vera::getWindowHeight();
    vera::Shader::setUniform(pSVar45,(string *)&local_148,(float)iVar31,(float)iVar30);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_viewport","");
    vera::Shader::setUniform(pSVar45,(string *)&local_148,(float)local_178._0_4_,fVar54);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_model","");
    vera::Shader::setUniform(pSVar45,(string *)&local_148,1.0,1.0,1.0);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    _local_1a0 = (vec2)&local_190;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"u_modelMatrix","");
    local_148.x = 1.0;
    aStack_144.y = 0.0;
    aStack_140 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    aStack_13c.w = 0.0;
    aStack_138._M_allocated_capacity._0_4_ = 0;
    aStack_138._M_allocated_capacity._4_4_ = 0x3f800000;
    aStack_138._8_8_ = 0;
    pvStack_128 = (pointer)0x0;
    local_120.z = 1.0;
    local_11c.w = 0.0;
    aStack_118.x = 0.0;
    aStack_114.y = 0.0;
    aStack_110.z = 0.0;
    local_10c.w = 1.0;
    vera::Shader::setUniform(pSVar45,(string *)&local_1a0,(mat4 *)&local_148,false);
    if (_local_1a0 != (vec2)&local_190) {
      operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
    }
    _local_1a0 = (vec2)&local_190;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"u_viewMatrix","");
    local_148.x = 1.0;
    aStack_144.y = 0.0;
    aStack_140 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    aStack_13c.w = 0.0;
    aStack_138._M_allocated_capacity._0_4_ = 0;
    aStack_138._M_allocated_capacity._4_4_ = 0x3f800000;
    aStack_138._8_8_ = 0;
    pvStack_128 = (pointer)0x0;
    local_120.z = 1.0;
    local_11c.w = 0.0;
    aStack_118.x = 0.0;
    aStack_114.y = 0.0;
    aStack_110.z = 0.0;
    local_10c.w = 1.0;
    vera::Shader::setUniform(pSVar45,(string *)&local_1a0,(mat4 *)&local_148,false);
    if (_local_1a0 != (vec2)&local_190) {
      operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
    }
    _local_1a0 = (vec2)&local_190;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"u_projectionMatrix","");
    local_148.x = 1.0;
    aStack_144.y = 0.0;
    aStack_140.x = 0.0;
    aStack_13c.w = 0.0;
    aStack_138._M_allocated_capacity._0_4_ = 0;
    aStack_138._M_allocated_capacity._4_4_ = 0x3f800000;
    aStack_138._8_8_ = 0;
    pvStack_128 = (pointer)0x0;
    local_120.z = 1.0;
    local_11c.w = 0.0;
    aStack_118.x = 0.0;
    aStack_114.y = 0.0;
    aStack_110.z = 0.0;
    local_10c.w = 1.0;
    vera::Shader::setUniform(pSVar45,(string *)&local_1a0,(mat4 *)&local_148,false);
    if (_local_1a0 != (vec2)&local_190) {
      operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
    }
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"u_modelViewProjectionMatrix","");
    pmVar43 = vera::getOrthoMatrix();
    vera::Shader::setUniform(pSVar45,(string *)&local_148,pmVar43,false);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_plotData","");
    vera::Shader::setUniformTexture(pSVar45,(string *)&local_148,this->m_plot_texture,0);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    pVVar44 = vera::getBillboard();
    vera::Vbo::render(pVVar44,pSVar45);
    if ((this->uniforms).tracker.m_running == true) {
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"renderUI:plot_data","");
      Tracker::end(this_01,(string *)&local_148);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  if (this->cursor == true) {
    bVar29 = vera::getMouseEntered();
    if (bVar29) {
      if ((this->uniforms).tracker.m_running == true) {
        _local_148 = (vec2)&aStack_138;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"renderUI:cursor","");
        Tracker::begin(this_01,(string *)&local_148);
        if (_local_148 != (vec2)&aStack_138) {
          operator_delete((void *)_local_148,
                          CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                   aStack_138._M_allocated_capacity._0_4_) + 1);
        }
      }
      if ((this->m_cross_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>
          ._M_t.super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
          super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl == (Vbo *)0x0) {
        this_00 = (Vbo *)operator_new(0x60);
        local_1a0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
        aStack_19c = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
        local_198 = (vec2)((ulong)local_198 & 0xffffffff00000000);
        vera::crossMesh((Mesh *)&local_148,(vec3 *)&local_1a0,10.0);
        vera::Vbo::Vbo(this_00,(Mesh *)&local_148);
        pVVar44 = (this->m_cross_vbo)._M_t.
                  super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
                  super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
                  super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl;
        (this->m_cross_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>.
        _M_t.super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
        super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl = this_00;
        if (pVVar44 != (Vbo *)0x0) {
          (*pVVar44->_vptr_Vbo[1])();
        }
        vera::Mesh::~Mesh((Mesh *)&local_148);
      }
      pSVar45 = vera::getFillShader();
      vera::Shader::use(pSVar45);
      _local_1a0 = (vec2)&local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a0,"u_modelViewProjectionMatrix","");
      pmVar43 = vera::getOrthoMatrix();
      fVar51 = vera::getMouseX();
      fVar54 = vera::getMouseY();
      uVar19 = pmVar43->value[0].field_0;
      uVar20 = pmVar43->value[0].field_1;
      uVar21 = pmVar43->value[0].field_2;
      uVar22 = pmVar43->value[0].field_3;
      uVar23 = pmVar43->value[1].field_0;
      uVar24 = pmVar43->value[1].field_1;
      aStack_138._8_4_ = pmVar43->value[1].field_2;
      aStack_138._12_4_ = pmVar43->value[1].field_3;
      pvStack_128 = *(pointer *)(pmVar43->value + 2);
      uVar25 = pmVar43->value[2].field_2;
      uVar26 = pmVar43->value[2].field_3;
      uVar3 = pmVar43->value[0].field_0;
      uVar9 = pmVar43->value[0].field_1;
      uVar4 = pmVar43->value[0].field_2;
      uVar10 = pmVar43->value[0].field_3;
      uVar5 = pmVar43->value[1].field_0;
      uVar11 = pmVar43->value[1].field_1;
      uVar6 = pmVar43->value[1].field_2;
      uVar12 = pmVar43->value[1].field_3;
      uVar7 = pmVar43->value[2].field_0;
      uVar13 = pmVar43->value[2].field_1;
      uVar8 = pmVar43->value[2].field_2;
      uVar14 = pmVar43->value[2].field_3;
      aStack_118.x = (float)uVar7 * 0.0 + fVar54 * (float)uVar5 + fVar51 * (float)uVar3 +
                     pmVar43->value[3].field_0.x;
      aStack_114.y = (float)uVar13 * 0.0 + (float)uVar11 * fVar54 + (float)uVar9 * fVar51 +
                     pmVar43->value[3].field_1.y;
      aStack_110.z = (float)uVar8 * 0.0 + fVar54 * (float)uVar6 + fVar51 * (float)uVar4 +
                     pmVar43->value[3].field_2.z;
      local_10c.w = (float)uVar14 * 0.0 + (float)uVar12 * fVar54 + (float)uVar10 * fVar51 +
                    pmVar43->value[3].field_3.w;
      local_148 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)uVar19;
      aStack_144 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)uVar20;
      aStack_140 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)uVar21;
      aStack_13c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uVar22;
      aStack_138._M_allocated_capacity._0_4_ = uVar23;
      aStack_138._M_allocated_capacity._4_4_ = uVar24;
      local_120 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)uVar25;
      local_11c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uVar26;
      vera::Shader::setUniform(pSVar45,(string *)&local_1a0,(mat4 *)&local_148,false);
      if (_local_1a0 != (vec2)&local_190) {
        operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
      }
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_color","");
      vera::Shader::setUniform(pSVar45,(string *)&local_148,1.0,1.0,1.0,1.0);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      vera::Vbo::render((this->m_cross_vbo)._M_t.
                        super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
                        super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
                        super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl,pSVar45);
      if ((this->uniforms).tracker.m_running == true) {
        _local_148 = (vec2)&aStack_138;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"renderUI:cursor","");
        Tracker::end(this_01,(string *)&local_148);
        if (_local_148 != (vec2)&aStack_138) {
          operator_delete((void *)_local_148,
                          CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                   aStack_138._M_allocated_capacity._0_4_) + 1);
        }
      }
    }
  }
  if (((this->frag_index == -1) && (this->vert_index == -1)) && (this->geom_index == -1)) {
    WVar33 = vera::getWindowStyle();
    if (WVar33 != EMBEDDED) {
      iVar31 = vera::getWindowWidth();
      local_178._0_4_ = (float)iVar31;
      iVar31 = vera::getWindowHeight();
      fVar51 = (float)iVar31;
      local_17c = (float)local_178._0_4_ * 0.05;
      local_98._0_4_ = (float)iVar31 * 0.05;
      pCVar46 = vera::getCamera();
      vera::resetCamera();
      vera::fill(0.0,0.0,0.0,0.75);
      vera::noStroke();
      _x_00.x = (float)local_178._0_4_ * 0.5;
      aStack_144.y = fVar51 * 0.5;
      aStack_19c.y = fVar51 - ((float)local_98._0_4_ + (float)local_98._0_4_);
      local_1a0.x = (float)local_178._0_4_ - (local_17c + local_17c);
      local_148.x = _x_00.x;
      vera::rect((vec2 *)&local_148,(vec2 *)&local_1a0,(Shader *)0x0);
      vera::fill(1.0);
      vera::textAngle(0.0,(Font *)0x0);
      vera::textAlign(ALIGN_MIDDLE,(Font *)0x0);
      vera::textAlign(ALIGN_CENTER,(Font *)0x0);
      vera::textSize(38.0,(Font *)0x0);
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Drag & Drop","");
      vera::text((string *)&local_148,_x_00.x,fVar51 * 0.45,(Font *)0x0);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      vera::textSize(22.0,(Font *)0x0);
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,".vert .frag .ply .lst .obj .gltf .glb","");
      vera::text((string *)&local_148,_x_00.x,fVar51 * 0.55,(Font *)0x0);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      vera::setCamera(pCVar46);
    }
  }
  if (this->help == true) {
    iVar31 = vera::getWindowWidth();
    fVar51 = (float)iVar31;
    iVar31 = vera::getWindowHeight();
    local_17c = (float)iVar31;
    local_98._0_4_ = (float)iVar31 * 0.05;
    local_178._0_4_ = fVar51 * 0.05 + fVar51 * 0.05;
    local_1bc = (float)iVar31 * 0.05 * 3.0;
    pCVar46 = vera::getCamera();
    vera::resetCamera();
    vera::fill(0.0,0.0,0.0,0.75);
    vera::noStroke();
    local_148.x = fVar51 * 0.5;
    aStack_144.y = local_17c * 0.5;
    aStack_19c.y = local_17c - ((float)local_98._0_4_ + (float)local_98._0_4_);
    local_1a0.x = fVar51 - (float)local_178._0_4_;
    vera::rect((vec2 *)&local_148,(vec2 *)&local_1a0,(Shader *)0x0);
    vera::fill(1.0);
    vera::textAlign(ALIGN_MIDDLE,(Font *)0x0);
    vera::textAlign(ALIGN_LEFT,(Font *)0x0);
    vera::textAngle(0.0,(Font *)0x0);
    vera::textSize(22.0,(Font *)0x0);
    fVar51 = vera::getFontHeight();
    fVar51 = fVar51 * 1.5;
    if (this->geom_index != -1) {
      bVar29 = (this->m_sceneRender).showAxis != false;
      pcVar48 = "show";
      pcVar49 = "show";
      if (bVar29) {
        pcVar49 = "hide";
      }
      local_168[0] = local_158;
      pcVar28 = "show";
      pcVar27 = "show";
      if (bVar29) {
        pcVar27 = "hide";
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,pcVar49,pcVar27 + 4);
      pvVar37 = (vec2 *)std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0x2f1025);
      vVar47 = (vec2)(pvVar37 + 2);
      if (*pvVar37 == vVar47) {
        local_190._M_allocated_capacity = *(undefined8 *)vVar47;
        local_190._8_8_ = pvVar37[3];
        _local_1a0 = (vec2)&local_190;
      }
      else {
        local_190._M_allocated_capacity = *(undefined8 *)vVar47;
        _local_1a0 = *pvVar37;
      }
      local_198 = pvVar37[1];
      *pvVar37 = vVar47;
      pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      *(undefined1 *)&pvVar37[2].field_0 = 0;
      pvVar37 = (vec2 *)std::__cxx11::string::append((char *)&local_1a0);
      vVar47 = (vec2)(pvVar37 + 2);
      if (*pvVar37 == vVar47) {
        aStack_138._8_8_ = pvVar37[3];
        aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
        aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
        _local_148 = (vec2)&aStack_138;
      }
      else {
        aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
        aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
        _local_148 = *pvVar37;
      }
      aStack_140 = pvVar37[1].field_0;
      aStack_13c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                   pvVar37[1].field_1;
      *pvVar37 = vVar47;
      pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      *(undefined1 *)&pvVar37[2].field_0 = 0;
      vera::text((string *)&local_148,(float)local_178._0_4_,local_1bc,(Font *)0x0);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      if (_local_1a0 != (vec2)&local_190) {
        operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
      }
      if (local_168[0] != local_158) {
        operator_delete(local_168[0],local_158[0] + 1);
      }
      bVar29 = (this->m_sceneRender).showBBoxes != false;
      if (bVar29) {
        pcVar48 = "hide";
      }
      local_168[0] = local_158;
      if (bVar29) {
        pcVar28 = "hide";
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,pcVar48,pcVar28 + 4);
      pvVar37 = (vec2 *)std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0x2f1034);
      vVar47 = (vec2)(pvVar37 + 2);
      if (*pvVar37 == vVar47) {
        local_190._M_allocated_capacity = *(undefined8 *)vVar47;
        local_190._8_8_ = pvVar37[3];
        _local_1a0 = (vec2)&local_190;
      }
      else {
        local_190._M_allocated_capacity = *(undefined8 *)vVar47;
        _local_1a0 = *pvVar37;
      }
      local_198 = pvVar37[1];
      *pvVar37 = vVar47;
      pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      *(undefined1 *)&pvVar37[2].field_0 = 0;
      pvVar37 = (vec2 *)std::__cxx11::string::append((char *)&local_1a0);
      vVar47 = (vec2)(pvVar37 + 2);
      if (*pvVar37 == vVar47) {
        aStack_138._8_8_ = pvVar37[3];
        aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
        aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
        _local_148 = (vec2)&aStack_138;
      }
      else {
        aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
        aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
        _local_148 = *pvVar37;
      }
      aStack_140 = pvVar37[1].field_0;
      aStack_13c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                   pvVar37[1].field_1;
      *pvVar37 = vVar47;
      pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      *(undefined1 *)&pvVar37[2].field_0 = 0;
      vera::text((string *)&local_148,(float)local_178._0_4_,local_1bc + fVar51,(Font *)0x0);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      if (_local_1a0 != (vec2)&local_190) {
        operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
      }
      if (local_168[0] != local_158) {
        operator_delete(local_168[0],local_158[0] + 1);
      }
      local_1bc = local_1bc + fVar51 + fVar51;
    }
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"c - hide/show cursor","");
    vera::text((string *)&local_148,(float)local_178._0_4_,local_1bc,(Font *)0x0);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    local_1bc = local_1bc + fVar51;
    if (this->geom_index != -1) {
      uVar40 = (ulong)(this->m_sceneRender).dynamicShadows;
      pcVar48 = "enable";
      if (uVar40 != 0) {
        pcVar48 = "disable";
      }
      local_168[0] = local_158;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,pcVar48,pcVar48 + uVar40 + 6);
      pvVar37 = (vec2 *)std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0x2f104e);
      vVar47 = (vec2)(pvVar37 + 2);
      if (*pvVar37 == vVar47) {
        local_190._M_allocated_capacity = *(undefined8 *)vVar47;
        local_190._8_8_ = pvVar37[3];
        _local_1a0 = (vec2)&local_190;
      }
      else {
        local_190._M_allocated_capacity = *(undefined8 *)vVar47;
        _local_1a0 = *pvVar37;
      }
      local_198 = pvVar37[1];
      *pvVar37 = vVar47;
      pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      *(undefined1 *)&pvVar37[2].field_0 = 0;
      pvVar37 = (vec2 *)std::__cxx11::string::append((char *)&local_1a0);
      vVar47 = (vec2)(pvVar37 + 2);
      if (*pvVar37 == vVar47) {
        aStack_138._8_8_ = pvVar37[3];
        aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
        aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
        _local_148 = (vec2)&aStack_138;
      }
      else {
        aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
        aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
        _local_148 = *pvVar37;
      }
      aStack_140 = pvVar37[1].field_0;
      aStack_13c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                   pvVar37[1].field_1;
      *pvVar37 = vVar47;
      pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      *(undefined1 *)&pvVar37[2].field_0 = 0;
      vera::text((string *)&local_148,(float)local_178._0_4_,local_1bc,(Font *)0x0);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      if (_local_1a0 != (vec2)&local_190) {
        operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
      }
      if (local_168[0] != local_158) {
        operator_delete(local_168[0],local_158[0] + 1);
      }
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"f - hide/show floor","")
      ;
      vera::text((string *)&local_148,(float)local_178._0_4_,local_1bc + fVar51,(Font *)0x0);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      local_1bc = local_1bc + fVar51 + fVar51;
    }
    bVar29 = vera::isFullscreen();
    pcVar49 = "enable";
    pcVar48 = "enable";
    if (bVar29) {
      pcVar48 = "disable";
    }
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,pcVar48,pcVar48 + (ulong)bVar29 + 6);
    pvVar37 = (vec2 *)std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0x2f1076);
    vVar47 = (vec2)(pvVar37 + 2);
    if (*pvVar37 == vVar47) {
      local_190._M_allocated_capacity = *(undefined8 *)vVar47;
      local_190._8_8_ = pvVar37[3];
      _local_1a0 = (vec2)&local_190;
    }
    else {
      local_190._M_allocated_capacity = *(undefined8 *)vVar47;
      _local_1a0 = *pvVar37;
    }
    local_198 = pvVar37[1];
    *pvVar37 = vVar47;
    pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
    *(undefined1 *)&pvVar37[2].field_0 = 0;
    pvVar37 = (vec2 *)std::__cxx11::string::append((char *)&local_1a0);
    vVar47 = (vec2)(pvVar37 + 2);
    if (*pvVar37 == vVar47) {
      aStack_138._8_8_ = pvVar37[3];
      aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
      aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
      _local_148 = (vec2)&aStack_138;
    }
    else {
      aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
      aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
      _local_148 = *pvVar37;
    }
    aStack_140 = pvVar37[1].field_0;
    aStack_13c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)pvVar37[1].field_1;
    *pvVar37 = vVar47;
    pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
    *(undefined1 *)&pvVar37[2].field_0 = 0;
    vera::text((string *)&local_148,(float)local_178._0_4_,local_1bc,(Font *)0x0);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    if (_local_1a0 != (vec2)&local_190) {
      operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
    }
    if (local_168[0] != local_158) {
      operator_delete(local_168[0],local_158[0] + 1);
    }
    local_1bc = local_1bc + fVar51;
    if (this->geom_index != -1) {
      pcVar48 = "show";
      bVar29 = (this->m_sceneRender).showGrid != false;
      if (bVar29) {
        pcVar48 = "hide";
      }
      pcVar27 = "show";
      if (bVar29) {
        pcVar27 = "hide";
      }
      local_168[0] = local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,pcVar48,pcVar27 + 4);
      pvVar37 = (vec2 *)std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0x2f107b);
      vVar47 = (vec2)(pvVar37 + 2);
      if (*pvVar37 == vVar47) {
        local_190._M_allocated_capacity = *(undefined8 *)vVar47;
        local_190._8_8_ = pvVar37[3];
        _local_1a0 = (vec2)&local_190;
      }
      else {
        local_190._M_allocated_capacity = *(undefined8 *)vVar47;
        _local_1a0 = *pvVar37;
      }
      local_198 = pvVar37[1];
      *pvVar37 = vVar47;
      pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      *(undefined1 *)&pvVar37[2].field_0 = 0;
      pvVar37 = (vec2 *)std::__cxx11::string::append((char *)&local_1a0);
      vVar47 = (vec2)(pvVar37 + 2);
      if (*pvVar37 == vVar47) {
        aStack_138._8_8_ = pvVar37[3];
        aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
        aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
        _local_148 = (vec2)&aStack_138;
      }
      else {
        aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
        aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
        _local_148 = *pvVar37;
      }
      aStack_140 = pvVar37[1].field_0;
      aStack_13c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                   pvVar37[1].field_1;
      *pvVar37 = vVar47;
      pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      *(undefined1 *)&pvVar37[2].field_0 = 0;
      vera::text((string *)&local_148,(float)local_178._0_4_,local_1bc,(Font *)0x0);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      if (_local_1a0 != (vec2)&local_190) {
        operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
      }
      if (local_168[0] != local_158) {
        operator_delete(local_168[0],local_158[0] + 1);
      }
      local_1bc = local_1bc + fVar51;
    }
    pcVar48 = "show";
    bVar29 = this->help != false;
    if (bVar29) {
      pcVar48 = "hide";
    }
    pcVar27 = "show";
    if (bVar29) {
      pcVar27 = "hide";
    }
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,pcVar48,pcVar27 + 4);
    pvVar37 = (vec2 *)std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0x2f1080);
    vVar47 = (vec2)(pvVar37 + 2);
    if (*pvVar37 == vVar47) {
      local_190._M_allocated_capacity = *(undefined8 *)vVar47;
      local_190._8_8_ = pvVar37[3];
      _local_1a0 = (vec2)&local_190;
    }
    else {
      local_190._M_allocated_capacity = *(undefined8 *)vVar47;
      _local_1a0 = *pvVar37;
    }
    local_198 = pvVar37[1];
    *pvVar37 = vVar47;
    pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
    *(undefined1 *)&pvVar37[2].field_0 = 0;
    pvVar37 = (vec2 *)std::__cxx11::string::append((char *)&local_1a0);
    vVar47 = (vec2)(pvVar37 + 2);
    if (*pvVar37 == vVar47) {
      aStack_138._8_8_ = pvVar37[3];
      aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
      aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
      _local_148 = (vec2)&aStack_138;
    }
    else {
      aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
      aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
      _local_148 = *pvVar37;
    }
    aStack_140 = pvVar37[1].field_0;
    aStack_13c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)pvVar37[1].field_1;
    *pvVar37 = vVar47;
    pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
    *(undefined1 *)&pvVar37[2].field_0 = 0;
    vera::text((string *)&local_148,(float)local_178._0_4_,local_1bc,(Font *)0x0);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    if (_local_1a0 != (vec2)&local_190) {
      operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
    }
    if (local_168[0] != local_158) {
      operator_delete(local_168[0],local_158[0] + 1);
    }
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"i - hide/show extra info","");
    vera::text((string *)&local_148,(float)local_178._0_4_,local_1bc + fVar51,(Font *)0x0);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"o - open shaders on default editor","");
    local_1bc = local_1bc + fVar51 + fVar51;
    vera::text((string *)&local_148,(float)local_178._0_4_,local_1bc,(Font *)0x0);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"p - hide/show render passes/buffers","");
    local_1bc = local_1bc + fVar51;
    vera::text((string *)&local_148,(float)local_178._0_4_,local_1bc,(Font *)0x0);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    local_1bc = local_1bc + fVar51;
    if ((this->uniforms).super_Scene.streams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
    {
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"r - restart stream textures","");
      vera::text((string *)&local_148,(float)local_178._0_4_,local_1bc,(Font *)0x0);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      local_1bc = local_1bc + fVar51;
    }
    if (this->geom_index != -1) {
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"s - hide/show sky","");
      vera::text((string *)&local_148,(float)local_178._0_4_,local_1bc,(Font *)0x0);
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
      local_1bc = local_1bc + fVar51;
    }
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"t - hide/show loaded textures","");
    vera::text((string *)&local_148,(float)local_178._0_4_,local_1bc,(Font *)0x0);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    if ((ulong)this->verbose != 0) {
      pcVar49 = "disable";
    }
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,pcVar49,pcVar49 + (ulong)this->verbose + 6);
    pvVar37 = (vec2 *)std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0x2f1137);
    vVar47 = (vec2)(pvVar37 + 2);
    if (*pvVar37 == vVar47) {
      local_190._M_allocated_capacity = *(undefined8 *)vVar47;
      local_190._8_8_ = pvVar37[3];
      _local_1a0 = (vec2)&local_190;
    }
    else {
      local_190._M_allocated_capacity = *(undefined8 *)vVar47;
      _local_1a0 = *pvVar37;
    }
    local_198 = pvVar37[1];
    *pvVar37 = vVar47;
    pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
    *(undefined1 *)&pvVar37[2].field_0 = 0;
    pvVar37 = (vec2 *)std::__cxx11::string::append((char *)&local_1a0);
    vVar47 = (vec2)(pvVar37 + 2);
    if (*pvVar37 == vVar47) {
      aStack_138._8_8_ = pvVar37[3];
      aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
      aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
      _local_148 = (vec2)&aStack_138;
    }
    else {
      aStack_138._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar47;
      aStack_138._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar47 >> 0x20);
      _local_148 = *pvVar37;
    }
    aStack_140 = pvVar37[1].field_0;
    aStack_13c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)pvVar37[1].field_1;
    *pvVar37 = vVar47;
    pvVar37[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    pvVar37[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
    *(undefined1 *)&pvVar37[2].field_0 = 0;
    vera::text((string *)&local_148,(float)local_178._0_4_,local_1bc + fVar51,(Font *)0x0);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
    if (_local_1a0 != (vec2)&local_190) {
      operator_delete((void *)_local_1a0,local_190._M_allocated_capacity + 1);
    }
    if (local_168[0] != local_158) {
      operator_delete(local_168[0],local_158[0] + 1);
    }
    this_01 = local_88;
    if ((this->uniforms).super_Scene.streams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
    {
      _local_148 = (vec2)&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"space - start/stop stream textures","");
      vera::text((string *)&local_148,(float)local_178._0_4_,fVar51 + local_1bc + fVar51,(Font *)0x0
                );
      if (_local_148 != (vec2)&aStack_138) {
        operator_delete((void *)_local_148,
                        CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                                 aStack_138._M_allocated_capacity._0_4_) + 1);
      }
    }
    vera::setCamera(pCVar46);
    glDisable(0xb71);
  }
  if ((this->uniforms).tracker.m_running == true) {
    _local_148 = (vec2)&aStack_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"renderUI","");
    Tracker::end(this_01,(string *)&local_148);
    if (_local_148 != (vec2)&aStack_138) {
      operator_delete((void *)_local_148,
                      CONCAT44(aStack_138._M_allocated_capacity._4_4_,
                               aStack_138._M_allocated_capacity._0_4_) + 1);
    }
  }
  return;
}

Assistant:

void Sandbox::renderUI() {
    TRACK_BEGIN("renderUI")

    // // IN PUT TEXTURES
    if (m_showTextures) {      

        int nTotal = uniforms.textures.size();
        if (nTotal > 0) {
            glDisable(GL_DEPTH_TEST);
            TRACK_BEGIN("renderUI:textures")
            float w = (float)(vera::getWindowWidth());
            float h = (float)(vera::getWindowHeight());
            float a = h/w;
            float scale = fmin(1.0f / (float)(nTotal), 0.25) * 0.5;
            float xStep = w * scale * a;
            float yStep = h * scale;
            float xOffset = xStep;
            float yOffset = h - yStep;
            
            vera::textAngle(0.0);
            vera::textAlign(vera::ALIGN_TOP);
            vera::textAlign(vera::ALIGN_LEFT);
            vera::textSize(xStep * 0.2f / vera::getPixelDensity(false));

            for (vera::TexturesMap::iterator it = uniforms.textures.begin(); it != uniforms.textures.end(); it++) {
                float imgAspect = ((float)it->second->getWidth()/(float)it->second->getHeight());
                float imgW = xStep * imgAspect;
                vera::TextureStreamsMap::const_iterator slit = uniforms.streams.find(it->first);
                if ( slit != uniforms.streams.end() )
                    vera::image((vera::TextureStream*)slit->second, xStep * 0.5 + imgW * 0.5, yOffset, imgW, yStep, true);
                else 
                    vera::image(it->second, xStep * 0.5 + imgW * 0.5, yOffset, imgW, yStep);

                vera::text(it->first, 0, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }
            TRACK_END("renderUI:textures")
        }
    }

    // RESULTING BUFFERS
    if (m_showPasses) {
        glDisable(GL_DEPTH_TEST);
        TRACK_BEGIN("renderUI:buffers")

        // DEBUG BUFFERS
        int nTotal = uniforms.buffers.size();
        nTotal += uniforms.doubleBuffers.size();
        nTotal += uniforms.pyramids.size();
        nTotal += uniforms.floods.size();
        if (uniforms.models.size() > 0 ) {
            nTotal += 1;
            nTotal += uniforms.functions["u_scene"].present;
            nTotal += uniforms.functions["u_sceneDepth"].present;
        }
        nTotal += uniforms.functions["u_sceneNormal"].present;
        nTotal += uniforms.functions["u_scenePosition"].present;
        nTotal += m_sceneRender.getBuffersTotal();
        
        if (nTotal > 0) {
            float w = (float)(vera::getWindowWidth());
            float h = (float)(vera::getWindowHeight());
            float scale = fmin(1.0f / (float)(nTotal), 0.25) * 0.5;
            float xStep = w * scale;
            float yStep = h * scale;
            float xOffset = w - xStep;
            float yOffset = h - yStep;

            vera::textAngle(0.0);
            vera::textSize(xStep * 0.2f / vera::getPixelDensity(false));
            vera::textAlign(vera::ALIGN_TOP);
            vera::textAlign(vera::ALIGN_LEFT);

            for (size_t i = 0; i < uniforms.buffers.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.buffers[i]->getWidth()/(float)uniforms.buffers[i]->getHeight());
                offset.x += xStep - scale.x;

                vera::image(uniforms.buffers[i], offset.x, offset.y, scale.x, scale.y);
                vera::text("u_buffer" + vera::toString(i), xOffset - scale.x, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }

            for (size_t i = 0; i < uniforms.doubleBuffers.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.doubleBuffers[i]->src->getWidth()/(float)uniforms.doubleBuffers[i]->src->getHeight());
                offset.x += xStep - scale.x;

                vera::image(uniforms.doubleBuffers[i]->src, offset.x, offset.y, scale.x, scale.y);
                vera::text("u_doubleBuffer" + vera::toString(i), xOffset - scale.x, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }

            for (size_t i = 0; i < uniforms.pyramids.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.pyramids[i].getWidth()/(float)uniforms.pyramids[i].getHeight());
                float w = scale.x;
                offset.x += xStep - w;
                for (size_t j = 0; j < uniforms.pyramids[i].getDepth() * 2; j++ ) {

                    if (j < uniforms.pyramids[i].getDepth())
                        vera::image(uniforms.pyramids[i].getResult(j), offset.x, offset.y, scale.x, scale.y);
                    else 
                        vera::image(uniforms.pyramids[i].getResult(j), offset.x + w * 2.0f, offset.y, scale.x, scale.y);

                    offset.x -= scale.x;
                    if (j < uniforms.pyramids[i].getDepth()) {
                        scale *= 0.5;
                        offset.y = yOffset - yStep * 0.5;
                    }
                    else {
                        offset.y = yOffset + yStep * 0.5;
                        scale *= 2.0;
                    }
                    offset.x -= scale.x;

                }

                vera::text("u_pyramid0" + vera::toString(i), xOffset - scale.x * 2.0, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;

            }

            for (size_t i = 0; i < uniforms.floods.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.floods[i].dst->getWidth()/(float)uniforms.floods[i].dst->getHeight());
                offset.x += xStep - scale.x;

                vera::image(uniforms.floods[i].dst, offset.x, offset.y, scale.x, scale.y);
                vera::text("u_flood" + vera::toString(i), xOffset - scale.x, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }

            if (uniforms.models.size() > 0) {
                vera::fill(0.0);
                for (vera::LightsMap::iterator it = uniforms.lights.begin(); it != uniforms.lights.end(); ++it ) {
                    if ( it->second->getShadowMap()->isAllocated() && it->second->getShadowMap()->getDepthTextureId() ) {
                        vera::imageDepth(it->second->getShadowMap(), xOffset, yOffset, xStep, yStep, it->second->getShadowMapFar(), it->second->getShadowMapNear());
                        // vera::image(it->second->getShadowMap(), xOffset, yOffset, xStep, yStep);
                        vera::text("u_lightShadowMap", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                        yOffset -= yStep * 2.0;
                    }
                }
                vera::fill(1.0);
            }

            if (uniforms.functions["u_scenePosition"].present) {
                vera::image(&m_sceneRender.positionFbo, xOffset, yOffset, xStep, yStep);
                vera::text("u_scenePosition", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            if (uniforms.functions["u_sceneNormal"].present) {
                vera::image(&m_sceneRender.normalFbo, xOffset, yOffset, xStep, yStep);
                vera::text("u_sceneNormal", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            for (size_t i = 0; i < m_sceneRender.buffersFbo.size(); i++) {
                vera::image(m_sceneRender.buffersFbo[i], xOffset, yOffset, xStep, yStep);
                vera::text("u_sceneBuffer" + vera::toString(i), xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            if (uniforms.functions["u_scene"].present) {
                vera::image(&m_sceneRender.renderFbo, xOffset, yOffset, xStep, yStep);
                vera::text("u_scene", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            if (uniforms.functions["u_sceneDepth"].present) {
                vera::fill(0.0);
                if (uniforms.activeCamera)
                    vera::imageDepth(&m_sceneRender.renderFbo, xOffset, yOffset, xStep, yStep, uniforms.activeCamera->getFarClip(), uniforms.activeCamera->getNearClip());
                vera::text("u_sceneDepth", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
                vera::fill(1.0);
            }
        }
        TRACK_END("renderUI:buffers")
    }

    if (m_plot != PLOT_OFF && m_plot_texture ) {
        glDisable(GL_DEPTH_TEST);
        TRACK_BEGIN("renderUI:plot_data")

        float p = vera::getPixelDensity();
        float w = 100 * p;
        float h = 30 * p;
        float x = (float)(vera::getWindowWidth()) * 0.5;
        float y = h + 10;

        m_plot_shader.use();
        m_plot_shader.setUniform("u_scale", w, h);
        m_plot_shader.setUniform("u_translate", x, y);
        m_plot_shader.setUniform("u_resolution", (float)vera::getWindowWidth(), (float)vera::getWindowHeight());
        m_plot_shader.setUniform("u_viewport", w, h);
        m_plot_shader.setUniform("u_model", glm::vec3(1.0f));
        m_plot_shader.setUniform("u_modelMatrix", glm::mat4(1.0f));
        m_plot_shader.setUniform("u_viewMatrix", glm::mat4(1.0f));
        m_plot_shader.setUniform("u_projectionMatrix", glm::mat4(1.0f));
        m_plot_shader.setUniform("u_modelViewProjectionMatrix", vera::getOrthoMatrix());
        m_plot_shader.setUniformTexture("u_plotData", m_plot_texture, 0);
        
        vera::getBillboard()->render(&m_plot_shader);
        TRACK_END("renderUI:plot_data")
    }

    if (cursor && vera::getMouseEntered()) {
        TRACK_BEGIN("renderUI:cursor")
        if (m_cross_vbo == nullptr)
            m_cross_vbo = std::unique_ptr<vera::Vbo>(new vera::Vbo( vera::crossMesh( glm::vec3(0.0f, 0.0f, 0.0f), 10.0f) ));

        vera::Shader* fill = vera::getFillShader();
        fill->use();
        fill->setUniform("u_modelViewProjectionMatrix", glm::translate(vera::getOrthoMatrix(), glm::vec3(vera::getMouseX(), vera::getMouseY(), 0.0f) ) );
        fill->setUniform("u_color", glm::vec4(1.0f));
        m_cross_vbo->render(fill);
        TRACK_END("renderUI:cursor")
    }

    if (frag_index == -1 && vert_index == -1 && geom_index == -1 && vera::getWindowStyle() != vera::EMBEDDED) {
        float w = (float)(vera::getWindowWidth());
        float h = (float)(vera::getWindowHeight());
        float xStep = w * 0.05;
        float yStep = h * 0.05;
        float x = xStep * 2.0f;
        float y = yStep * 3.0f;

        vera::Camera *cam = vera::getCamera();
        vera::resetCamera();

        vera::fill(0.0f, 0.0f, 0.0f, 0.75f);
        vera::noStroke();
        vera::rect(glm::vec2(w * 0.5f, h * 0.5f), glm::vec2(w - xStep * 2.0f, h - yStep * 2.0f));

        vera::fill(1.0f);

        vera::textAngle(0.0f);
        vera::textAlign(vera::ALIGN_MIDDLE);
        vera::textAlign(vera::ALIGN_CENTER);

        vera::textSize(38.0f);
        vera::text("Drag & Drop", w * 0.5f, h * 0.45f);

        vera::textSize(22.0f);
        vera::text(".vert .frag .ply .lst .obj .gltf .glb", w * 0.5f, h * 0.55f);

        vera::setCamera(cam);
    }

    if (help) {
        float w = (float)(vera::getWindowWidth());
        float h = (float)(vera::getWindowHeight());
        float xStep = w * 0.05;
        float yStep = h * 0.05;
        float x = xStep * 2.0f;
        float y = yStep * 3.0f;

        vera::Camera *cam = vera::getCamera();
        vera::resetCamera();

        vera::fill(0.0f, 0.0f, 0.0f, 0.75f);
        vera::noStroke();
        vera::rect(glm::vec2(w * 0.5f, h * 0.5f), glm::vec2(w - xStep * 2.0f, h - yStep * 2.0f));

        vera::fill(1.0f);
        vera::textAlign(vera::ALIGN_MIDDLE);
        vera::textAlign(vera::ALIGN_LEFT);
        vera::textAngle(0.0f);
        vera::textSize(22.0f);
        yStep = vera::getFontHeight() * 1.5f;

        if (geom_index != -1) {
            vera::text("a - " + std::string( m_sceneRender.showAxis? "hide" : "show" ) + " axis", x, y);
            y += yStep;
            vera::text("b - " + std::string( m_sceneRender.showBBoxes? "hide" : "show" ) + " bounding boxes", x, y);
            y += yStep;
        }

        vera::text("c - hide/show cursor", x, y);
        y += yStep;

        if (geom_index != -1) {
            vera::text("d - " + std::string( m_sceneRender.dynamicShadows? "disable" : "enable" ) + " dynamic shadows", x, y);
            y += yStep;
            vera::text("f - hide/show floor", x, y);
            y += yStep;
        }
        vera::text("F - " + std::string( vera::isFullscreen() ? "disable" : "enable" ) + " fullscreen", x, y);
        y += yStep;
        if (geom_index != -1) {
            vera::text("g - " + std::string( m_sceneRender.showGrid? "hide" : "show" ) + " grid", x, y);
            y += yStep;
        }

        vera::text("h - " + std::string( help? "hide" : "show" ) + " help", x, y);
        y += yStep;
        vera::text("i - hide/show extra info", x, y);
        y += yStep;
        vera::text("o - open shaders on default editor", x, y);
        y += yStep;
        vera::text("p - hide/show render passes/buffers", x, y);
        y += yStep;

        if (uniforms.streams.size() > 0) {
            vera::text("r - restart stream textures", x, y);
            y += yStep;
        }

        if (geom_index != -1) {
            vera::text("s - hide/show sky", x, y);
            y += yStep;
        }

        vera::text("t - hide/show loaded textures", x, y);
        y += yStep;
        vera::text("v - " + std::string( verbose? "disable" : "enable" ) + " verbose", x, y);
        y += yStep;

        if (uniforms.streams.size() > 0) {
            vera::text("space - start/stop stream textures", x, y);
            y += yStep;
        }
        
        vera::setCamera(cam);
        glDisable(GL_DEPTH_TEST);
    }

    TRACK_END("renderUI")
}